

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

int __thiscall CServer::Run(CServer *this)

{
  CNetServer *this_00;
  CConfig *pCVar1;
  IKernel *pIVar2;
  IConsole *pConsole;
  NETADDR_conflict BindAddr;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  int64 iVar6;
  int64 iVar7;
  int64 iVar8;
  CInput *pCVar9;
  long lVar10;
  int c_1;
  long lVar11;
  byte bVar12;
  int c;
  ulong uVar13;
  CClient *this_01;
  CInput *pCVar14;
  long in_FS_OFFSET;
  bool aSpecs [64];
  char aBuf [256];
  byte abStack_1a8 [64];
  char local_168 [256];
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  uchar auStack_5c [4];
  undefined8 local_58;
  NETADDR local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x17])
                    (this->m_pConsole,(ulong)(uint)this->m_pConfig->m_ConsoleOutputLevel,
                     SendRconLineAuthed,this);
  this->m_PrintCBIndex = iVar4;
  InitMapList(this);
  iVar4 = LoadMap(this,this->m_pConfig->m_SvMap);
  pCVar1 = this->m_pConfig;
  if (iVar4 == 0) {
    dbg_msg("server","failed to load map. mapname=\'%s\'",pCVar1->m_SvMap);
  }
  else {
    this->m_MapChunksPerRequest = pCVar1->m_SvMapDownloadSpeed;
    if ((pCVar1->m_Bindaddr[0] == '\0') ||
       (iVar4 = net_host_lookup(pCVar1->m_Bindaddr,&local_50,3), iVar4 != 0)) {
      mem_zero(&local_50,0x18);
    }
    local_50.type = 3;
    pCVar1 = this->m_pConfig;
    local_50.port = (unsigned_short)pCVar1->m_SvPort;
    this_00 = &this->m_NetServer;
    local_68 = 3;
    uStack_64 = local_50.ip._0_4_;
    uStack_60 = local_50.ip._4_4_;
    auStack_5c[0] = local_50.ip[8];
    auStack_5c[1] = local_50.ip[9];
    auStack_5c[2] = local_50.ip[10];
    auStack_5c[3] = local_50.ip[0xb];
    local_58 = CONCAT26(local_50.reserved,CONCAT24(local_50.port,local_50.ip._12_4_));
    pIVar2 = (this->super_IServer).super_IInterface.m_pKernel;
    pConsole = this->m_pConsole;
    iVar4 = (*pIVar2->_vptr_IKernel[2])(pIVar2,"engine");
    BindAddr.ip[0] = (undefined1)uStack_64;
    BindAddr.ip[1] = uStack_64._1_1_;
    BindAddr.ip[2] = uStack_64._2_1_;
    BindAddr.ip[3] = uStack_64._3_1_;
    BindAddr.type = local_68;
    BindAddr.ip[8] = auStack_5c[0];
    BindAddr.ip[9] = auStack_5c[1];
    BindAddr.ip[10] = auStack_5c[2];
    BindAddr.ip[0xb] = auStack_5c[3];
    BindAddr.ip[4] = (undefined1)uStack_60;
    BindAddr.ip[5] = uStack_60._1_1_;
    BindAddr.ip[6] = uStack_60._2_1_;
    BindAddr.ip[7] = uStack_60._3_1_;
    BindAddr.ip[0xc] = (undefined1)local_58;
    BindAddr.ip[0xd] = local_58._1_1_;
    BindAddr.ip[0xe] = local_58._2_1_;
    BindAddr.ip[0xf] = local_58._3_1_;
    BindAddr.port = local_58._4_2_;
    BindAddr.reserved = local_58._6_2_;
    bVar3 = CNetServer::Open(this_00,BindAddr,pCVar1,pConsole,
                             (IEngine *)CONCAT44(extraout_var,iVar4),
                             &(this->m_ServerBan).super_CNetBan,this->m_pConfig->m_SvMaxClients,
                             this->m_pConfig->m_SvMaxClientsPerIP,NewClientCallback,
                             DelClientCallback,this);
    if (bVar3) {
      CEcon::Init(&this->m_Econ,this->m_pConfig,this->m_pConsole,&(this->m_ServerBan).super_CNetBan)
      ;
      str_format(local_168,0x100,"server name is \'%s\'",this->m_pConfig->m_SvName);
      (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                (this->m_pConsole,0,"server",local_168,0);
      (*(this->m_pGameServer->super_IInterface)._vptr_IInterface[2])();
      iVar4 = (*(this->m_pGameServer->super_IInterface)._vptr_IInterface[0x15])();
      str_format(local_168,0x100,"netversion %s",CONCAT44(extraout_var_00,iVar4));
      (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                (this->m_pConsole,0,"server",local_168,0);
      iVar4 = (*(this->m_pGameServer->super_IInterface)._vptr_IInterface[0x16])();
      iVar5 = (*(this->m_pGameServer->super_IInterface)._vptr_IInterface[0x17])();
      iVar4 = str_comp((char *)CONCAT44(extraout_var_01,iVar4),
                       (char *)CONCAT44(extraout_var_02,iVar5));
      if (iVar4 != 0) {
        (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                  (this->m_pConsole,0,"server","WARNING: netversion hash differs",0);
      }
      iVar4 = (*(this->m_pGameServer->super_IInterface)._vptr_IInterface[0x14])();
      str_format(local_168,0x100,"game version %s",CONCAT44(extraout_var_03,iVar4));
      (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                (this->m_pConsole,0,"server",local_168,0);
      (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x10])(this->m_pConsole,0);
      if (this->m_GeneratedRconPassword != 0) {
        dbg_msg("server","+-------------------------+");
        dbg_msg("server","| rcon password: \'%s\' |",this->m_pConfig->m_SvRconPassword);
        dbg_msg("server","+-------------------------+");
      }
      iVar6 = time_get();
      this->m_GameStartTime = iVar6;
      do {
        if (this->m_RunServer != true) goto LAB_0011372e;
        if ((this->m_MapReload != false) || (0x6ffffffe < (this->super_IServer).m_CurrentGameTick))
        {
          this->m_MapReload = false;
          iVar4 = LoadMap(this,this->m_pConfig->m_SvMap);
          if (iVar4 == 0) {
            str_format(local_168,0x100,"failed to load map. mapname=\'%s\'",this->m_pConfig->m_SvMap
                      );
            (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                      (this->m_pConsole,0,"server",local_168,0);
            str_copy(this->m_pConfig->m_SvMap,this->m_aCurrentMap,0x80);
          }
          else {
            uVar13 = 0;
            do {
              iVar4 = (*(this->m_pGameServer->super_IInterface)._vptr_IInterface[0x12])
                                (this->m_pGameServer,uVar13 & 0xffffffff);
              abStack_1a8[uVar13] = (byte)iVar4;
              uVar13 = uVar13 + 1;
            } while (uVar13 != 0x40);
            (*(this->m_pGameServer->super_IInterface)._vptr_IInterface[4])();
            lVar11 = 0;
            this_01 = this->m_aClients;
            do {
              if (1 < this_01->m_State) {
                SendMap(this,(int)lVar11);
                CClient::Reset(this_01);
                this_01->m_State = abStack_1a8[lVar11] | 2;
              }
              lVar11 = lVar11 + 1;
              this_01 = this_01 + 1;
            } while (lVar11 != 0x40);
            iVar6 = time_get();
            this->m_GameStartTime = iVar6;
            (this->super_IServer).m_CurrentGameTick = 0;
            pIVar2 = (this->super_IServer).super_IInterface.m_pKernel;
            (*pIVar2->_vptr_IKernel[1])(pIVar2,"gameserver",this->m_pGameServer);
            (*(this->m_pGameServer->super_IInterface)._vptr_IInterface[2])();
          }
        }
        iVar6 = time_get();
        iVar4 = (this->super_IServer).m_CurrentGameTick;
        lVar11 = this->m_GameStartTime;
        iVar7 = time_freq();
        lVar11 = (iVar7 * ((long)iVar4 + 1)) / 0x32 + lVar11;
        if (lVar11 < iVar6) {
          bVar12 = 0;
          do {
            iVar4 = (this->super_IServer).m_CurrentGameTick;
            (this->super_IServer).m_CurrentGameTick = iVar4 + 1;
            uVar13 = 0;
            pCVar14 = this->m_aClients[0].m_aInputs;
            do {
              iVar5 = this->m_aClients[uVar13].m_State;
              if (iVar5 != 0) {
                lVar10 = 200;
                pCVar9 = pCVar14;
                do {
                  if (pCVar9->m_GameTick == (this->super_IServer).m_CurrentGameTick) {
                    if (iVar5 == 5) {
                      (*(this->m_pGameServer->super_IInterface)._vptr_IInterface[0xe])
                                (this->m_pGameServer,uVar13 & 0xffffffff);
                    }
                    break;
                  }
                  pCVar9 = pCVar9 + 1;
                  lVar10 = lVar10 + -1;
                } while (lVar10 != 0);
              }
              uVar13 = uVar13 + 1;
              pCVar14 = (CInput *)((long)(pCVar14 + 0xc9) + 0xcc);
            } while (uVar13 != 0x40);
            bVar12 = bVar12 | (byte)iVar4;
            (*(this->m_pGameServer->super_IInterface)._vptr_IInterface[5])();
            iVar4 = (this->super_IServer).m_CurrentGameTick;
            lVar10 = this->m_GameStartTime;
            iVar7 = time_freq();
          } while ((iVar7 * ((long)iVar4 + 1)) / 0x32 + lVar10 < iVar6);
          if (lVar11 < iVar6) {
            if (this->m_pConfig->m_SvHighBandwidth != 0 || (bVar12 & 1) != 0) {
              DoSnapshot(this);
            }
            UpdateClientRconCommands(this);
            UpdateClientMapListEntries(this);
          }
        }
        CRegister::RegisterUpdate
                  (&this->m_Register,(this->m_NetServer).super_CNetBase.m_Socket.type);
        PumpNetwork(this);
        iVar4 = (this->super_IServer).m_CurrentGameTick;
        lVar11 = this->m_GameStartTime;
        iVar6 = time_freq();
        iVar7 = time_get();
        iVar8 = time_freq();
        iVar4 = (int)((((lVar11 - iVar7) + (iVar6 * ((long)iVar4 + 1)) / 0x32) * 1000) / iVar8);
        if (9 < iVar4) {
          iVar4 = 10;
        }
        if (iVar4 < 2) {
          iVar4 = 1;
        }
        CNetBase::Wait(&this_00->super_CNetBase,iVar4);
      } while (InterruptSignaled == 0);
      (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                (this->m_pConsole,0,"server","interrupted",0);
LAB_0011372e:
      CNetServer::Close(this_00,this->m_aShutdownReason);
      CEcon::Shutdown(&this->m_Econ);
      (*(this->m_pGameServer->super_IInterface)._vptr_IInterface[4])();
      Free(this);
      iVar4 = 0;
      goto LAB_001137a7;
    }
    dbg_msg("server","couldn\'t open socket. port %d might already be in use",
            (ulong)(uint)this->m_pConfig->m_SvPort);
  }
  Free(this);
  iVar4 = -1;
LAB_001137a7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

int CServer::Run()
{
	//
	m_PrintCBIndex = Console()->RegisterPrintCallback(Config()->m_ConsoleOutputLevel, SendRconLineAuthed, this);

	InitMapList();

	// load map
	if(!LoadMap(Config()->m_SvMap))
	{
		dbg_msg("server", "failed to load map. mapname='%s'", Config()->m_SvMap);
		Free();
		return -1;
	}
	m_MapChunksPerRequest = Config()->m_SvMapDownloadSpeed;

	// start server
	NETADDR BindAddr;
	if(Config()->m_Bindaddr[0] && net_host_lookup(Config()->m_Bindaddr, &BindAddr, NETTYPE_ALL) == 0)
	{
		// sweet!
		BindAddr.type = NETTYPE_ALL;
		BindAddr.port = Config()->m_SvPort;
	}
	else
	{
		mem_zero(&BindAddr, sizeof(BindAddr));
		BindAddr.type = NETTYPE_ALL;
		BindAddr.port = Config()->m_SvPort;
	}

	if(!m_NetServer.Open(BindAddr, Config(), Console(), Kernel()->RequestInterface<IEngine>(), &m_ServerBan,
		Config()->m_SvMaxClients, Config()->m_SvMaxClientsPerIP, NewClientCallback, DelClientCallback, this))
	{
		dbg_msg("server", "couldn't open socket. port %d might already be in use", Config()->m_SvPort);
		Free();
		return -1;
	}

	m_Econ.Init(Config(), Console(), &m_ServerBan);

	char aBuf[256];
	str_format(aBuf, sizeof(aBuf), "server name is '%s'", Config()->m_SvName);
	Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "server", aBuf);

	GameServer()->OnInit();
	str_format(aBuf, sizeof(aBuf), "netversion %s", GameServer()->NetVersion());
	Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "server", aBuf);
	if(str_comp(GameServer()->NetVersionHashUsed(), GameServer()->NetVersionHashReal()))
	{
		m_pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "server", "WARNING: netversion hash differs");
	}
	str_format(aBuf, sizeof(aBuf), "game version %s", GameServer()->Version());
	Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "server", aBuf);

	// process pending commands
	m_pConsole->StoreCommands(false);

	if(m_GeneratedRconPassword)
	{
		dbg_msg("server", "+-------------------------+");
		dbg_msg("server", "| rcon password: '%s' |", Config()->m_SvRconPassword);
		dbg_msg("server", "+-------------------------+");
	}

	// start game
	{
		m_GameStartTime = time_get();

		while(m_RunServer)
		{
			// load new map
			if(m_MapReload || m_CurrentGameTick >= 0x6FFFFFFF) //	force reload to make sure the ticks stay within a valid range
			{
				m_MapReload = false;

				// load map
				if(LoadMap(Config()->m_SvMap))
				{
					// new map loaded
					bool aSpecs[MAX_CLIENTS];
					for(int c = 0; c < MAX_CLIENTS; c++)
						aSpecs[c] = GameServer()->IsClientSpectator(c);

					GameServer()->OnShutdown();

					for(int c = 0; c < MAX_CLIENTS; c++)
					{
						if(m_aClients[c].m_State <= CClient::STATE_AUTH)
							continue;

						SendMap(c);
						m_aClients[c].Reset();
						m_aClients[c].m_State = aSpecs[c] ? CClient::STATE_CONNECTING_AS_SPEC : CClient::STATE_CONNECTING;
					}

					m_GameStartTime = time_get();
					m_CurrentGameTick = 0;
					Kernel()->ReregisterInterface(GameServer());
					GameServer()->OnInit();
				}
				else
				{
					str_format(aBuf, sizeof(aBuf), "failed to load map. mapname='%s'", Config()->m_SvMap);
					Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "server", aBuf);
					str_copy(Config()->m_SvMap, m_aCurrentMap, sizeof(Config()->m_SvMap));
				}
			}

			int64 Now = time_get();
			bool NewTicks = false;
			bool ShouldSnap = false;
			while(Now > TickStartTime(m_CurrentGameTick+1))
			{
				m_CurrentGameTick++;
				NewTicks = true;
				if((m_CurrentGameTick%2) == 0)
					ShouldSnap = true;

				// apply new input
				for(int c = 0; c < MAX_CLIENTS; c++)
				{
					if(m_aClients[c].m_State == CClient::STATE_EMPTY)
						continue;
					for(int i = 0; i < 200; i++)
					{
						if(m_aClients[c].m_aInputs[i].m_GameTick == Tick())
						{
							if(m_aClients[c].m_State == CClient::STATE_INGAME)
								GameServer()->OnClientPredictedInput(c, m_aClients[c].m_aInputs[i].m_aData);
							break;
						}
					}
				}

				GameServer()->OnTick();
			}

			// snap game
			if(NewTicks)
			{
				if(Config()->m_SvHighBandwidth || ShouldSnap)
					DoSnapshot();

				UpdateClientRconCommands();
				UpdateClientMapListEntries();
			}

			// master server stuff
			m_Register.RegisterUpdate(m_NetServer.NetType());

			PumpNetwork();

			// wait for incoming data
			m_NetServer.Wait(clamp(int((TickStartTime(m_CurrentGameTick+1)-time_get())*1000/time_freq()), 1, 1000/SERVER_TICK_SPEED/2));

			if(InterruptSignaled)
			{
				Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "server", "interrupted");
				break;
			}
		}
	}
	// disconnect all clients on shutdown
	m_NetServer.Close(m_aShutdownReason);
	m_Econ.Shutdown();

	GameServer()->OnShutdown();
	Free();

	return 0;
}